

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcodecompile.cc
# Opt level: O0

void __thiscall ExprTree::setOutput(ExprTree *this,VarnodeTpl *newout)

{
  bool bVar1;
  SleighError *this_00;
  reference ppOVar2;
  OpTpl *this_01;
  VarnodeTpl *this_02;
  allocator local_41;
  string local_40 [32];
  OpTpl *local_20;
  OpTpl *op;
  VarnodeTpl *newout_local;
  ExprTree *this_local;
  
  op = (OpTpl *)newout;
  newout_local = (VarnodeTpl *)this;
  if (this->outvn == (VarnodeTpl *)0x0) {
    this_00 = (SleighError *)__cxa_allocate_exception(0x20);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_40,"Expression has no output",&local_41);
    SleighError::SleighError(this_00,(string *)local_40);
    __cxa_throw(this_00,&SleighError::typeinfo,SleighError::~SleighError);
  }
  bVar1 = VarnodeTpl::isUnnamed(this->outvn);
  if (bVar1) {
    if (this->outvn != (VarnodeTpl *)0x0) {
      operator_delete(this->outvn);
    }
    ppOVar2 = std::vector<OpTpl_*,_std::allocator<OpTpl_*>_>::back(this->ops);
    local_20 = *ppOVar2;
    OpTpl::clearOutput(local_20);
    OpTpl::setOutput(local_20,(VarnodeTpl *)op);
  }
  else {
    this_01 = (OpTpl *)operator_new(0x28);
    OpTpl::OpTpl(this_01,CPUI_COPY);
    local_20 = this_01;
    OpTpl::addInput(this_01,this->outvn);
    OpTpl::setOutput(local_20,(VarnodeTpl *)op);
    std::vector<OpTpl_*,_std::allocator<OpTpl_*>_>::push_back(this->ops,&local_20);
  }
  this_02 = (VarnodeTpl *)operator_new(0x68);
  VarnodeTpl::VarnodeTpl(this_02,(VarnodeTpl *)op);
  this->outvn = this_02;
  return;
}

Assistant:

void ExprTree::setOutput(VarnodeTpl *newout)

{				// Force the output of the expression to be new out
				// If the original output is named, this requires
				// an extra COPY op
  OpTpl *op;
  if (outvn == (VarnodeTpl *)0)
    throw SleighError("Expression has no output");
  if (outvn->isUnnamed()) {
    delete outvn;
    op = ops->back();
    op->clearOutput();
    op->setOutput(newout);
  }
  else {
    op = new OpTpl(CPUI_COPY);
    op->addInput(outvn);
    op->setOutput(newout);
    ops->push_back(op);
  }
  outvn = new VarnodeTpl(*newout);
}